

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O2

void disas_crypto_three_reg_sha512(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *s_00;
  TCGv_i64 ret;
  bool bVar1;
  _Bool _Var2;
  uint uVar3;
  TCGv_i64 tcg_dest;
  TCGv_i64 tcg_dest_00;
  TCGv_i64 tcg_src;
  TCGv_i64 tcg_src_00;
  TCGv_ptr pTVar4;
  TCGv_ptr pTVar5;
  TCGv_ptr pTVar6;
  uintptr_t o_2;
  long lVar7;
  code *pcVar8;
  uint regno;
  uintptr_t o_1;
  uint regno_00;
  uintptr_t o;
  TCGv_i64 tcg_res [2];
  
  s_00 = s->uc->tcg_ctx;
  uVar3 = insn >> 10 & 3;
  if ((insn >> 0xe & 1) == 0) {
    switch(uVar3) {
    case 0:
      if ((s->isar->id_aa64isar0 & 0xe000) == 0) goto switchD_0063ade2_caseD_3;
      pcVar8 = gen_helper_crypto_sha512h;
      break;
    case 1:
      if ((s->isar->id_aa64isar0 & 0xe000) == 0) goto switchD_0063ade2_caseD_3;
      pcVar8 = gen_helper_crypto_sha512h2;
      break;
    case 2:
      if ((s->isar->id_aa64isar0 & 0xe000) == 0) goto switchD_0063ade2_caseD_3;
      pcVar8 = gen_helper_crypto_sha512su1;
      break;
    case 3:
      if ((s->isar->id_aa64isar0 & 0xf00000000) == 0) goto switchD_0063ade2_caseD_3;
      bVar1 = true;
      pcVar8 = (code *)0x0;
      goto LAB_0063ae6c;
    }
  }
  else {
    switch(uVar3) {
    case 0:
      if ((s->isar->id_aa64isar0 & 0xf000000000) == 0) goto switchD_0063ade2_caseD_3;
      pcVar8 = gen_helper_crypto_sm3partw1;
      break;
    case 1:
      if ((s->isar->id_aa64isar0 & 0xf000000000) == 0) goto switchD_0063ade2_caseD_3;
      pcVar8 = gen_helper_crypto_sm3partw2;
      break;
    case 2:
      if ((s->isar->id_aa64isar0 & 0xf0000000000) == 0) goto switchD_0063ade2_caseD_3;
      pcVar8 = gen_helper_crypto_sm4ekey;
      break;
    case 3:
switchD_0063ade2_caseD_3:
      unallocated_encoding_aarch64(s);
      return;
    }
  }
  bVar1 = false;
LAB_0063ae6c:
  _Var2 = fp_access_check(s);
  if (_Var2) {
    regno = insn >> 0x10 & 0x1f;
    regno_00 = insn >> 5 & 0x1f;
    uVar3 = insn & 0x1f;
    if (!bVar1) {
      pTVar4 = vec_full_reg_ptr(s,uVar3);
      pTVar5 = vec_full_reg_ptr(s,regno_00);
      pTVar6 = vec_full_reg_ptr(s,regno);
      (*pcVar8)(s_00,pTVar4,pTVar5,pTVar6);
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar4 + (long)s_00));
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar5 + (long)s_00));
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar6 + (long)s_00));
      return;
    }
    tcg_dest = tcg_temp_new_i64(s_00);
    tcg_dest_00 = tcg_temp_new_i64(s_00);
    tcg_src = tcg_temp_new_i64(s_00);
    tcg_res[0] = tcg_src;
    tcg_src_00 = tcg_temp_new_i64(s_00);
    tcg_res[1] = tcg_src_00;
    for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
      read_vec_element(s,tcg_dest,regno_00,(int)lVar7,MO_64);
      read_vec_element(s,tcg_dest_00,regno,(int)lVar7,MO_64);
      ret = tcg_res[lVar7];
      tcg_gen_rotli_i64_aarch64(s_00,ret,tcg_dest_00,1);
      tcg_gen_xor_i64_aarch64(s_00,ret,ret,tcg_dest);
    }
    write_vec_element(s,tcg_src,uVar3,0,MO_64);
    write_vec_element(s,tcg_src_00,uVar3,1,MO_64);
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(tcg_dest + (long)s_00));
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(tcg_dest_00 + (long)s_00));
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(tcg_src + (long)s_00));
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(tcg_src_00 + (long)s_00));
  }
  return;
}

Assistant:

static void disas_crypto_three_reg_sha512(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int opcode = extract32(insn, 10, 2);
    int o =  extract32(insn, 14, 1);
    int rm = extract32(insn, 16, 5);
    int rn = extract32(insn, 5, 5);
    int rd = extract32(insn, 0, 5);
    bool feature;
    CryptoThreeOpFn *genfn;

    if (o == 0) {
        switch (opcode) {
        case 0: /* SHA512H */
            feature = dc_isar_feature(aa64_sha512, s);
            genfn = gen_helper_crypto_sha512h;
            break;
        case 1: /* SHA512H2 */
            feature = dc_isar_feature(aa64_sha512, s);
            genfn = gen_helper_crypto_sha512h2;
            break;
        case 2: /* SHA512SU1 */
            feature = dc_isar_feature(aa64_sha512, s);
            genfn = gen_helper_crypto_sha512su1;
            break;
        case 3: /* RAX1 */
            feature = dc_isar_feature(aa64_sha3, s);
            genfn = NULL;
            break;
        default:
            g_assert_not_reached();
        }
    } else {
        switch (opcode) {
        case 0: /* SM3PARTW1 */
            feature = dc_isar_feature(aa64_sm3, s);
            genfn = gen_helper_crypto_sm3partw1;
            break;
        case 1: /* SM3PARTW2 */
            feature = dc_isar_feature(aa64_sm3, s);
            genfn = gen_helper_crypto_sm3partw2;
            break;
        case 2: /* SM4EKEY */
            feature = dc_isar_feature(aa64_sm4, s);
            genfn = gen_helper_crypto_sm4ekey;
            break;
        default:
            unallocated_encoding(s);
            return;
        }
    }

    if (!feature) {
        unallocated_encoding(s);
        return;
    }

    if (!fp_access_check(s)) {
        return;
    }

    if (genfn) {
        TCGv_ptr tcg_rd_ptr, tcg_rn_ptr, tcg_rm_ptr;

        tcg_rd_ptr = vec_full_reg_ptr(s, rd);
        tcg_rn_ptr = vec_full_reg_ptr(s, rn);
        tcg_rm_ptr = vec_full_reg_ptr(s, rm);

        genfn(tcg_ctx, tcg_rd_ptr, tcg_rn_ptr, tcg_rm_ptr);

        tcg_temp_free_ptr(tcg_ctx, tcg_rd_ptr);
        tcg_temp_free_ptr(tcg_ctx, tcg_rn_ptr);
        tcg_temp_free_ptr(tcg_ctx, tcg_rm_ptr);
    } else {
        TCGv_i64 tcg_op1, tcg_op2, tcg_res[2];
        int pass;

        tcg_op1 = tcg_temp_new_i64(tcg_ctx);
        tcg_op2 = tcg_temp_new_i64(tcg_ctx);
        tcg_res[0] = tcg_temp_new_i64(tcg_ctx);
        tcg_res[1] = tcg_temp_new_i64(tcg_ctx);

        for (pass = 0; pass < 2; pass++) {
            read_vec_element(s, tcg_op1, rn, pass, MO_64);
            read_vec_element(s, tcg_op2, rm, pass, MO_64);

            tcg_gen_rotli_i64(tcg_ctx, tcg_res[pass], tcg_op2, 1);
            tcg_gen_xor_i64(tcg_ctx, tcg_res[pass], tcg_res[pass], tcg_op1);
        }
        write_vec_element(s, tcg_res[0], rd, 0, MO_64);
        write_vec_element(s, tcg_res[1], rd, 1, MO_64);

        tcg_temp_free_i64(tcg_ctx, tcg_op1);
        tcg_temp_free_i64(tcg_ctx, tcg_op2);
        tcg_temp_free_i64(tcg_ctx, tcg_res[0]);
        tcg_temp_free_i64(tcg_ctx, tcg_res[1]);
    }
}